

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_make_greeting.c
# Opt level: O0

void * x11_make_greeting(int endian,int protomajor,int protominor,int auth_proto,void *auth_data,
                        int auth_len,char *peer_addr,int peer_port,int *outlen)

{
  char endian_00;
  size_t sVar1;
  char *__s;
  unsigned_long local_b0;
  unsigned_long peer_ip;
  time_t t;
  uint local_98;
  int greeting_len;
  int authdatalen_pad;
  int authdatalen;
  int authnamelen_pad;
  int authnamelen;
  uchar *authdata;
  char *authname;
  uchar realauthdata [64];
  uchar *greeting;
  int auth_len_local;
  void *auth_data_local;
  int auth_proto_local;
  int protominor_local;
  int protomajor_local;
  int endian_local;
  
  authdata = (uchar *)x11_authnames[auth_proto];
  sVar1 = strlen((char *)authdata);
  authdatalen = (int)sVar1;
  authdatalen_pad = authdatalen + 3U & 0xfffffffc;
  greeting_len = auth_len;
  _authnamelen_pad = (char **)auth_data;
  if (auth_proto != 1) {
    if ((auth_proto == 2) && (auth_len == 0x10)) {
      local_b0 = 0;
      x11_parse_ip(peer_addr,&local_b0);
      _authnamelen_pad = &authname;
      greeting_len = 0x18;
      memset(&authname,0,0x18);
      authname = *auth_data;
      PUT_32BIT_MSB_FIRST(realauthdata,(uint32_t)local_b0);
      PUT_16BIT_MSB_FIRST(realauthdata + 4,(uint16_t)peer_port);
      peer_ip = time((time_t *)0x0);
      PUT_32BIT_MSB_FIRST(realauthdata + 6,(uint32_t)peer_ip);
      des_encrypt_xdmauth((void *)((long)auth_data + 9),&authname,greeting_len);
    }
    else {
      _authnamelen_pad = &authname;
      greeting_len = 0;
    }
  }
  local_98 = greeting_len + 3U & 0xfffffffc;
  t._4_4_ = authdatalen_pad + 0xc + local_98;
  __s = (char *)safemalloc((long)t._4_4_,1,0);
  memset(__s,0,(long)t._4_4_);
  endian_00 = (char)endian;
  *__s = endian_00;
  PUT_16BIT_X11(endian_00,__s + 2,(uint16_t)protomajor);
  PUT_16BIT_X11(endian_00,__s + 4,(uint16_t)protominor);
  PUT_16BIT_X11(endian_00,__s + 6,(uint16_t)authdatalen);
  PUT_16BIT_X11(endian_00,__s + 8,(uint16_t)greeting_len);
  memcpy(__s + 0xc,authdata,(long)authdatalen);
  memcpy(__s + (long)authdatalen_pad + 0xc,_authnamelen_pad,(long)greeting_len);
  smemclr(&authname,0x40);
  *outlen = t._4_4_;
  return __s;
}

Assistant:

void *x11_make_greeting(int endian, int protomajor, int protominor,
                        int auth_proto, const void *auth_data, int auth_len,
                        const char *peer_addr, int peer_port,
                        int *outlen)
{
    unsigned char *greeting;
    unsigned char realauthdata[64];
    const char *authname;
    const unsigned char *authdata;
    int authnamelen, authnamelen_pad;
    int authdatalen, authdatalen_pad;
    int greeting_len;

    authname = x11_authnames[auth_proto];
    authnamelen = strlen(authname);
    authnamelen_pad = (authnamelen + 3) & ~3;

    if (auth_proto == X11_MIT) {
        authdata = auth_data;
        authdatalen = auth_len;
    } else if (auth_proto == X11_XDM && auth_len == 16) {
        time_t t;
        unsigned long peer_ip = 0;

        x11_parse_ip(peer_addr, &peer_ip);

        authdata = realauthdata;
        authdatalen = 24;
        memset(realauthdata, 0, authdatalen);
        memcpy(realauthdata, auth_data, 8);
        PUT_32BIT_MSB_FIRST(realauthdata+8, peer_ip);
        PUT_16BIT_MSB_FIRST(realauthdata+12, peer_port);
        t = time(NULL);
        PUT_32BIT_MSB_FIRST(realauthdata+14, t);

        des_encrypt_xdmauth((char *)auth_data + 9, realauthdata, authdatalen);
    } else {
        authdata = realauthdata;
        authdatalen = 0;
    }

    authdatalen_pad = (authdatalen + 3) & ~3;
    greeting_len = 12 + authnamelen_pad + authdatalen_pad;

    greeting = snewn(greeting_len, unsigned char);
    memset(greeting, 0, greeting_len);
    greeting[0] = endian;
    PUT_16BIT_X11(endian, greeting+2, protomajor);
    PUT_16BIT_X11(endian, greeting+4, protominor);
    PUT_16BIT_X11(endian, greeting+6, authnamelen);
    PUT_16BIT_X11(endian, greeting+8, authdatalen);
    memcpy(greeting+12, authname, authnamelen);
    memcpy(greeting+12+authnamelen_pad, authdata, authdatalen);

    smemclr(realauthdata, sizeof(realauthdata));

    *outlen = greeting_len;
    return greeting;
}